

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# degree.cpp
# Opt level: O0

void degree(void)

{
  size_type __n;
  reference this;
  reference pvVar1;
  iterator __first;
  iterator __last;
  mapped_type *pmVar2;
  ostream *poVar3;
  pair<unsigned_long,_int> pVar4;
  int local_74;
  int i_1;
  size_type local_50;
  pair<unsigned_long,_int> local_48;
  int local_38 [2];
  int i;
  allocator<std::pair<int,_int>_> local_21;
  undefined1 local_20 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> degree;
  
  freopen("degree.txt","w",_stdout);
  __n = (size_type)V;
  std::allocator<std::pair<int,_int>_>::allocator(&local_21);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_20,__n,
             &local_21);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_21);
  for (local_38[0] = 0; local_38[0] < V; local_38[0] = local_38[0] + 1) {
    this = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&edge,(long)local_38[0]);
    local_50 = std::vector<int,_std::allocator<int>_>::size(this);
    pVar4 = std::make_pair<unsigned_long,int&>(&local_50,local_38);
    local_48.first = pVar4.first;
    local_48.second = pVar4.second;
    pvVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_20,(long)local_38[0]);
    std::pair<int,int>::operator=((pair<int,int> *)pvVar1,&local_48);
  }
  __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_20);
  __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_20
                     );
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__last._M_current);
  local_74 = V;
  while (local_74 = local_74 + -1, -1 < local_74) {
    pvVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_20,(long)local_74);
    pmVar2 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,&pvVar1->second);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
    poVar3 = std::operator<<(poVar3,": ");
    pvVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_20,(long)local_74);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar1->first);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_20);
  return;
}

Assistant:

void degree() {
    freopen("degree.txt", "w", stdout); // output file

    vector< pair<int,int> > degree(V);
    for (int i = 0; i < V; i++) {
        degree[i] = make_pair(edge[i].size(), i);
    }

    stable_sort(degree.begin(), degree.end());

    for (int i = V-1; i >= 0; i--) {
        cout << name[degree[i].second] << ": " << degree[i].first << endl;
    }
}